

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortedObservableDictionary.hpp
# Opt level: O2

bool __thiscall
SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::IsEmpty(SortedObservableDictionary<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *this)

{
  pthread_mutex_t *__mutex;
  size_t sVar1;
  
  __mutex = (pthread_mutex_t *)
            (this->_mutex).super___shared_ptr<std::recursive_mutex,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  std::recursive_mutex::lock((recursive_mutex *)&__mutex->__data);
  sVar1 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pthread_mutex_unlock(__mutex);
  return sVar1 == 0;
}

Assistant:

virtual bool IsEmpty() const
    {
        Lock l(*_mutex);
        return _map.empty();
    }